

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O0

type rest_rpc::rpc_service::router::
     call_helper<void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,std::__cxx11::string_const&,std::__cxx11::string_const&),0ul,1ul,std::__cxx11::string,std::__cxx11::string>
               (_func_void_weak_ptr<rest_rpc::rpc_service::connection>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                **f,index_sequence<0UL,_1UL> *param_2,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *tup,weak_ptr<rest_rpc::rpc_service::connection> *ptr)

{
  code *pcVar1;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>_>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>_>_> *p_Var3;
  weak_ptr<rest_rpc::rpc_service::connection> *in_RCX;
  weak_ptr<rest_rpc::rpc_service::connection> *in_RDX;
  undefined8 *in_RDI;
  undefined1 local_30 [48];
  
  pcVar1 = (code *)*in_RDI;
  std::weak_ptr<rest_rpc::rpc_service::connection>::weak_ptr(in_RDX,in_RCX);
  p_Var2 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x20b07e);
  p_Var3 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x20b08d);
  (*pcVar1)(local_30,p_Var2,p_Var3);
  std::weak_ptr<rest_rpc::rpc_service::connection>::~weak_ptr
            ((weak_ptr<rest_rpc::rpc_service::connection> *)0x20b0ad);
  return;
}

Assistant:

static typename std::result_of<F(std::weak_ptr<connection>, Args...)>::type
  call_helper(const F &f, const nonstd::index_sequence<I...> &,
              std::tuple<Args...> tup, std::weak_ptr<connection> ptr) {
    return f(ptr, std::move(std::get<I>(tup))...);
  }